

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O0

void __thiscall skiwi::anon_unknown_23::getenvtest::getenvtest(getenvtest *this)

{
  getenvtest *this_local;
  
  compile_fixture::compile_fixture(&this->super_compile_fixture);
  (this->super_compile_fixture)._vptr_compile_fixture = (_func_int **)&PTR__getenvtest_0032e4a0;
  return;
}

Assistant:

void test()
      {
      TEST_EQ("#f", run("(getenv \"Jan\")"));

      TEST_EQ("#t", run("(putenv \"SkiwiTest\" \"DummyValue\")"));
      TEST_EQ("\"DummyValue\"", run("(getenv \"SkiwiTest\")"));

      TEST_EQ("#t", run("(putenv \"SkiwiTest\" \"DummyValu\")"));
      TEST_EQ("\"DummyValu\"", run("(getenv \"SkiwiTest\")"));

      TEST_EQ("#t", run("(putenv \"SkiwiTest\" \"DummyVal\")"));
      TEST_EQ("\"DummyVal\"", run("(getenv \"SkiwiTest\")"));

      TEST_EQ("#t", run("(putenv \"SkiwiTest\" \"DummyVa\")"));
      TEST_EQ("\"DummyVa\"", run("(getenv \"SkiwiTest\")"));

      TEST_EQ("#t", run("(putenv \"SkiwiTest\" \"DummyV\")"));
      TEST_EQ("\"DummyV\"", run("(getenv \"SkiwiTest\")"));

      TEST_EQ("#t", run("(putenv \"SkiwiTest\" \"Dummy\")"));
      TEST_EQ("\"Dummy\"", run("(getenv \"SkiwiTest\")"));

      TEST_EQ("#t", run("(putenv \"SkiwiTest\" \"\")"));

#ifdef _WIN32
      TEST_EQ("#f", run("(getenv \"SkiwiTest\")"));
#else
      TEST_EQ("\"\"", run("(getenv \"SkiwiTest\")"));
#endif
      }